

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5FindTokenizer(fts5_api *pApi,char *zName,void **ppUserData,fts5_tokenizer *pTokenizer)

{
  Fts5TokenizerModule *pFVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Fts5TokenizerModule *pMod;
  int rc;
  char *in_stack_ffffffffffffffc8;
  int local_24;
  
  local_24 = 0;
  pFVar1 = fts5LocateTokenizer((Fts5Global *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffc8);
  if (pFVar1 == (Fts5TokenizerModule *)0x0) {
    memset(in_RCX,0,0x18);
    *in_RDX = 0;
    local_24 = 1;
  }
  else {
    if (pFVar1->bV2Native == 0) {
      *in_RDX = pFVar1->pUserData;
    }
    else {
      *in_RDX = pFVar1;
    }
    *in_RCX = (pFVar1->x1).xCreate;
    in_RCX[1] = (pFVar1->x1).xDelete;
    in_RCX[2] = (pFVar1->x1).xTokenize;
  }
  return local_24;
}

Assistant:

static int fts5FindTokenizer(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void **ppUserData,
  fts5_tokenizer *pTokenizer      /* Populate this object */
){
  int rc = SQLITE_OK;
  Fts5TokenizerModule *pMod;

  pMod = fts5LocateTokenizer((Fts5Global*)pApi, zName);
  if( pMod ){
    if( pMod->bV2Native==0 ){
      *ppUserData = pMod->pUserData;
    }else{
      *ppUserData = (void*)pMod;
    }
    *pTokenizer = pMod->x1;
  }else{
    memset(pTokenizer, 0, sizeof(*pTokenizer));
    *ppUserData = 0;
    rc = SQLITE_ERROR;
  }

  return rc;
}